

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void CreateFunctionArgumentVariables
               (ExpressionContext *ctx,SynBase *source,FunctionData *function,
               ArrayView<ArgumentData> arguments,IntrusiveList<ExprVariableDefinition> *variables)

{
  SynBase *pSVar1;
  TypeBase *pTVar2;
  SynIdentifier *name;
  bool bVar3;
  uint uVar4;
  uint offset_00;
  ArgumentData *pAVar5;
  VariableData *this;
  TypeClass *pTVar6;
  ExprVariableDefinition *this_00;
  VariableHandle *pVVar7;
  char *pcVar8;
  InplaceStr name_00;
  TypeClass *classType;
  VariableData *variable;
  uint offset;
  bool conflict;
  ArgumentData *argument;
  uint i;
  IntrusiveList<ExprVariableDefinition> *variables_local;
  FunctionData *function_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  ArrayView<ArgumentData> arguments_local;
  
  pcVar8 = arguments._8_8_;
  ctx_local = (ExpressionContext *)arguments.data;
  arguments_local.data._0_4_ = arguments.count;
  argument._4_4_ = 0;
  while( true ) {
    uVar4 = ArrayView<ArgumentData>::size((ArrayView<ArgumentData> *)&ctx_local);
    if (uVar4 <= argument._4_4_) {
      return;
    }
    pAVar5 = ArrayView<ArgumentData>::operator[]
                       ((ArrayView<ArgumentData> *)&ctx_local,argument._4_4_);
    if (((pAVar5->type->isGeneric ^ 0xffU) & 1) == 0) break;
    name_00.end = pcVar8;
    name_00.begin = (pAVar5->name->name).end;
    bVar3 = anon_unknown.dwarf_e7629::CheckVariableConflict
                      ((anon_unknown_dwarf_e7629 *)ctx,(ExpressionContext *)pAVar5->source,
                       (SynBase *)(pAVar5->name->name).begin,name_00);
    offset_00 = anon_unknown.dwarf_e7629::AllocateArgumentInScope(ctx,source,4,pAVar5->type);
    this = ExpressionContext::get<VariableData>(ctx);
    pSVar1 = pAVar5->source;
    pTVar2 = pAVar5->type;
    name = pAVar5->name;
    uVar4 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar4 + 1;
    VariableData::VariableData(this,ctx->allocator,pSVar1,ctx->scope,0,pTVar2,name,offset_00,uVar4);
    pTVar6 = getType<TypeClass>(this->type);
    if ((pTVar6 != (TypeClass *)0x0) && ((pTVar6->hasFinalizer & 1U) != 0)) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,pAVar5->source,
                 "ERROR: cannot create \'%.*s\' that implements \'finalize\' on stack",
                 (ulong)(uint)((int)(pTVar6->super_TypeStruct).super_TypeBase.name.end -
                              (int)(pTVar6->super_TypeStruct).super_TypeBase.name.begin),
                 (pTVar6->super_TypeStruct).super_TypeBase.name.begin);
    }
    if (!bVar3) {
      ExpressionContext::AddVariable(ctx,this,true);
    }
    this_00 = ExpressionContext::get<ExprVariableDefinition>(ctx);
    pSVar1 = pAVar5->source;
    pTVar2 = ctx->typeVoid;
    pVVar7 = ExpressionContext::get<VariableHandle>(ctx);
    VariableHandle::VariableHandle(pVVar7,&pAVar5->name->super_SynBase,this);
    pcVar8 = (char *)0x0;
    ExprVariableDefinition::ExprVariableDefinition(this_00,pSVar1,pTVar2,pVVar7,(ExprBase *)0x0);
    IntrusiveList<ExprVariableDefinition>::push_back(variables,this_00);
    pVVar7 = ExpressionContext::get<VariableHandle>(ctx);
    VariableHandle::VariableHandle(pVVar7,pAVar5->source,this);
    IntrusiveList<VariableHandle>::push_back(&function->argumentVariables,pVVar7);
    argument._4_4_ = argument._4_4_ + 1;
  }
  __assert_fail("!argument.type->isGeneric",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x226b,
                "void CreateFunctionArgumentVariables(ExpressionContext &, SynBase *, FunctionData *, ArrayView<ArgumentData>, IntrusiveList<ExprVariableDefinition> &)"
               );
}

Assistant:

void CreateFunctionArgumentVariables(ExpressionContext &ctx, SynBase *source, FunctionData *function, ArrayView<ArgumentData> arguments, IntrusiveList<ExprVariableDefinition> &variables)
{
	for(unsigned i = 0; i < arguments.size(); i++)
	{
		ArgumentData &argument = arguments[i];

		assert(!argument.type->isGeneric);

		bool conflict = CheckVariableConflict(ctx, argument.source, argument.name->name);

		unsigned offset = AllocateArgumentInScope(ctx, source, 4, argument.type);
		VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, argument.source, ctx.scope, 0, argument.type, argument.name, offset, ctx.uniqueVariableId++);

		if(TypeClass *classType = getType<TypeClass>(variable->type))
		{
			if(classType->hasFinalizer)
				Stop(ctx, argument.source, "ERROR: cannot create '%.*s' that implements 'finalize' on stack", FMT_ISTR(classType->name));
		}

		if(!conflict)
			ctx.AddVariable(variable, true);

		variables.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(argument.source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(argument.name, variable), NULL));

		function->argumentVariables.push_back(new (ctx.get<VariableHandle>()) VariableHandle(argument.source, variable));
	}
}